

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshproxy.c
# Opt level: O3

SeatPromptResult *
sshproxy_confirm_weak_cached_hostkey
          (SeatPromptResult *__return_storage_ptr__,Seat *seat,char *algname,char *betteralgs,
          _func_void_void_ptr_SeatPromptResult *callback,void *ctx)

{
  SeatVtable *pSVar1;
  
  pSVar1 = seat[-0x411].vt;
  if (pSVar1 == (SeatVtable *)0x0) {
    sshproxy_error((SshProxy *)(seat + -0x416),
                   "First host key type stored for server is %s, below warning threshold. Abandoning proxy SSH connection."
                  );
    make_spr_sw_abort_static
              (__return_storage_ptr__,"Noninteractive SSH proxy cannot confirm weak cached host key"
              );
  }
  else {
    (**(code **)(pSVar1->output + 0x70))(__return_storage_ptr__,pSVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

static SeatPromptResult sshproxy_confirm_weak_cached_hostkey(
        Seat *seat, const char *algname, const char *betteralgs,
        void (*callback)(void *ctx, SeatPromptResult result), void *ctx)
{
    SshProxy *sp = container_of(seat, SshProxy, seat);

    if (sp->clientseat) {
        /*
         * If we have access to the outer Seat, pass this prompt
         * request on to it.
         */
        return seat_confirm_weak_cached_hostkey(
            wrap(sp->clientseat), algname, betteralgs, callback, ctx);
    }

    /*
     * Otherwise, behave as if we're in batch mode: take the safest
     * option.
     */
    sshproxy_error(sp, "First host key type stored for server is %s, below "
                   "warning threshold. Abandoning proxy SSH connection.",
                   algname);
    return SPR_SW_ABORT("Noninteractive SSH proxy cannot confirm "
                        "weak cached host key");
}